

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedInstancing::Cleanup(AdvancedInstancing *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&this->m_pipeline);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_vsp);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_fsp);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,this->m_vertex_array);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vertex_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_index_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_object_id_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_transform_buffer);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->m_transform_texture);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteProgramPipelines(1, &m_pipeline);
		glDeleteProgram(m_vsp);
		glDeleteProgram(m_fsp);
		glDeleteVertexArrays(2, m_vertex_array);
		glDeleteBuffers(1, &m_vertex_buffer);
		glDeleteBuffers(1, &m_index_buffer);
		glDeleteBuffers(1, &m_object_id_buffer);
		glDeleteBuffers(1, &m_transform_buffer);
		glDeleteTextures(1, &m_transform_texture);
		return NO_ERROR;
	}